

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

bool __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::nextIteration(MemoryTestInstance *this)

{
  ulong uVar1;
  uint uVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = this->m_iteration + 1;
  this->m_iteration = uVar4;
  uVar1 = this->m_iterationCount;
  resetResources(this);
  bVar5 = true;
  pcVar3 = createCommandsAndAllocateMemory;
  if (uVar1 <= uVar4) {
    uVar2 = this->m_memoryTypeNdx + 1;
    this->m_memoryTypeNdx = uVar2;
    bVar5 = uVar2 < (this->m_memoryProperties).memoryTypeCount;
    if (bVar5) {
      this->m_iteration = 0;
    }
    else {
      pcVar3 = (code *)0x0;
    }
  }
  this->m_stage = (StageFunc)pcVar3;
  *(undefined8 *)&this->field_0x258 = 0;
  return bVar5;
}

Assistant:

bool MemoryTestInstance::nextIteration (void)
{
	m_iteration++;

	if (m_iteration < m_iterationCount)
	{
		resetResources();
		m_stage = &MemoryTestInstance::createCommandsAndAllocateMemory;
		return true;
	}
	else
		return nextMemoryType();
}